

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Session::~Session(Session *this)

{
  ConfigData *in_RDI;
  
  cleanUp();
  Detail::unique_ptr<Catch::Config>::~unique_ptr((unique_ptr<Catch::Config> *)in_RDI);
  ConfigData::~ConfigData(in_RDI);
  Clara::Parser::~Parser((Parser *)in_RDI);
  return;
}

Assistant:

Session::~Session() {
        Catch::cleanUp();
    }